

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

void Prs_CreateBlifPio(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  int iVar1;
  int f;
  bool bVar2;
  int iFon;
  int iObj;
  int NameId;
  int i;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  Cba_NtkCleanObjFuncs(p);
  Cba_NtkCleanObjNames(p);
  Cba_NtkCleanFonNames(p);
  iObj = 0;
  while( true ) {
    iVar1 = Prs_NtkPiNum(pNtk);
    bVar2 = false;
    if (iObj < iVar1) {
      iFon = Vec_IntEntry(&pNtk->vInputs,iObj);
      bVar2 = iFon != 0;
    }
    if (!bVar2) break;
    iVar1 = Cba_ObjAlloc(p,CBA_OBJ_PI,0,1);
    Cba_ObjSetName(p,iVar1,iFon);
    f = Cba_ObjFon0(p,iVar1);
    Cba_FonSetName(p,f,iFon);
    Cba_NtkSetMap(p,iFon,f);
    Vec_IntPush(&p->vOrder,iVar1);
    iObj = iObj + 1;
  }
  iObj = 0;
  while( true ) {
    iVar1 = Prs_NtkPoNum(pNtk);
    bVar2 = false;
    if (iObj < iVar1) {
      iFon = Vec_IntEntry(&pNtk->vOutputs,iObj);
      bVar2 = iFon != 0;
    }
    if (!bVar2) break;
    iVar1 = Cba_ObjAlloc(p,CBA_OBJ_PO,1,0);
    Cba_ObjSetName(p,iVar1,iFon);
    Vec_IntPush(&p->vOrder,iVar1);
    iObj = iObj + 1;
  }
  return;
}

Assistant:

void Prs_CreateBlifPio( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    int i, NameId, iObj, iFon;
    Cba_NtkCleanObjFuncs( p );
    Cba_NtkCleanObjNames( p );
    Cba_NtkCleanFonNames( p );
    // create inputs
    Prs_NtkForEachPi( pNtk, NameId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        Cba_FonSetName( p, iFon, NameId );
        Cba_NtkSetMap( p, NameId, iFon );
        Vec_IntPush( &p->vOrder, iObj );
    }
    // create outputs
    Prs_NtkForEachPo( pNtk, NameId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( p, iObj, NameId );
        Vec_IntPush( &p->vOrder, iObj );
    }
}